

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  ImVector<ImFontAtlasCustomRect> *this;
  float x0;
  float y0;
  ImVec2 IVar1;
  char cVar2;
  ImWchar c;
  uint uVar3;
  ImFont *this_00;
  ImFontAtlasCustomRect *pIVar4;
  ImFont **ppIVar5;
  ImFontGlyph *pIVar6;
  long lVar7;
  ImVector<ImFont_*> *this_01;
  int i;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int i_1;
  ImVec2 local_40;
  ImVec2 local_38;
  
  if (atlas->CustomRectIds[0] < 0) {
    __assert_fail("atlas->CustomRectIds[0] >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x8d1,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x8d2,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  this = &atlas->CustomRects;
  pIVar4 = ImVector<ImFontAtlasCustomRect>::operator[](this,atlas->CustomRectIds[0]);
  if (pIVar4->X == 0xffff) {
    __assert_fail("r.IsPacked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x8d4,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  iVar8 = atlas->TexWidth;
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar4->Width != 0xd9) || (pIVar4->Height != 0x1b)) {
      __assert_fail("r.Width == FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF * 2 + 1 && r.Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                    ,0x8da,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    lVar7 = 0;
    for (iVar9 = 0; iVar9 != 0x1b; iVar9 = iVar9 + 1) {
      for (lVar10 = 0; (int)lVar10 != 0x6c; lVar10 = lVar10 + 1) {
        cVar2 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                [(int)lVar7 + lVar10];
        lVar11 = (long)(int)((uint)pIVar4->X + (int)lVar10 + ((uint)pIVar4->Y + iVar9) * iVar8);
        atlas->TexPixelsAlpha8[lVar11] = -(cVar2 == '.');
        atlas->TexPixelsAlpha8[lVar11 + 0x6d] = -(cVar2 == 'X');
      }
      lVar7 = (int)lVar7 + lVar10;
    }
  }
  else {
    if ((pIVar4->Width != 2) || (pIVar4->Height != 2)) {
      __assert_fail("r.Width == 2 && r.Height == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                    ,0x8e6,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar9 = (uint)pIVar4->Y * iVar8 + (uint)pIVar4->X;
    atlas->TexPixelsAlpha8[(long)(iVar8 + iVar9) + 1] = 0xff;
    atlas->TexPixelsAlpha8[iVar8 + iVar9] = 0xff;
    atlas->TexPixelsAlpha8[(long)iVar9 + 1] = 0xff;
    atlas->TexPixelsAlpha8[iVar9] = 0xff;
  }
  uVar3._0_2_ = pIVar4->X;
  uVar3._2_2_ = pIVar4->Y;
  IVar1 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar1.x * ((float)(uVar3 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar1.y * ((float)(uVar3 >> 0x10) + 0.5);
  for (iVar8 = 0; iVar8 < this->Size; iVar8 = iVar8 + 1) {
    pIVar4 = ImVector<ImFontAtlasCustomRect>::operator[](this,iVar8);
    if ((pIVar4->Font != (ImFont *)0x0) && (pIVar4->GlyphID != 0)) {
      if (pIVar4->Font->ContainerAtlas != atlas) {
        __assert_fail("r.Font->ContainerAtlas == atlas",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                      ,0x8f9,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
      }
      local_38.x = 0.0;
      local_38.y = 0.0;
      local_40.x = 0.0;
      local_40.y = 0.0;
      ImFontAtlas::CalcCustomRectUV(atlas,pIVar4,&local_38,&local_40);
      x0 = (pIVar4->GlyphOffset).x;
      y0 = (pIVar4->GlyphOffset).y;
      ImFont::AddGlyph(pIVar4->Font,(ImWchar)pIVar4->GlyphID,x0,y0,(float)pIVar4->Width + x0,
                       (float)pIVar4->Height + y0,local_38.x,local_38.y,local_40.x,local_40.y,
                       pIVar4->GlyphAdvanceX);
    }
  }
  this_01 = &atlas->Fonts;
  for (iVar8 = 0; iVar9 = this_01->Size, iVar8 < iVar9; iVar8 = iVar8 + 1) {
    ppIVar5 = ImVector<ImFont_*>::operator[](this_01,iVar8);
    if ((*ppIVar5)->DirtyLookupTables == true) {
      ppIVar5 = ImVector<ImFont_*>::operator[](this_01,iVar8);
      ImFont::BuildLookupTable(*ppIVar5);
    }
  }
  iVar8 = 0;
  do {
    if (iVar9 <= iVar8) {
      return;
    }
    ppIVar5 = ImVector<ImFont_*>::operator[](this_01,iVar8);
    this_00 = *ppIVar5;
    if (this_00->EllipsisChar == 0xffff) {
      lVar7 = 0;
      do {
        if (lVar7 == 4) goto LAB_0015354a;
        c = *(ImWchar *)((long)&DAT_0017e0d8 + lVar7);
        pIVar6 = ImFont::FindGlyphNoFallback(this_00,c);
        lVar7 = lVar7 + 2;
      } while (pIVar6 == (ImFontGlyph *)0x0);
      this_00->EllipsisChar = c;
    }
LAB_0015354a:
    iVar8 = iVar8 + 1;
    iVar9 = this_01->Size;
  } while( true );
}

Assistant:

static void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->CustomRectIds[0] >= 0);
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL);
    ImFontAtlasCustomRect& r = atlas->CustomRects[atlas->CustomRectIds[0]];
    IM_ASSERT(r.IsPacked());

    const int w = atlas->TexWidth;
    if (!(atlas->Flags & ImFontAtlasFlags_NoMouseCursors))
    {
        // Render/copy pixels
        IM_ASSERT(r.Width == FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF * 2 + 1 && r.Height == FONT_ATLAS_DEFAULT_TEX_DATA_H);
        for (int y = 0, n = 0; y < FONT_ATLAS_DEFAULT_TEX_DATA_H; y++)
            for (int x = 0; x < FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF; x++, n++)
            {
                const int offset0 = (int)(r.X + x) + (int)(r.Y + y) * w;
                const int offset1 = offset0 + FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF + 1;
                atlas->TexPixelsAlpha8[offset0] = FONT_ATLAS_DEFAULT_TEX_DATA_PIXELS[n] == '.' ? 0xFF : 0x00;
                atlas->TexPixelsAlpha8[offset1] = FONT_ATLAS_DEFAULT_TEX_DATA_PIXELS[n] == 'X' ? 0xFF : 0x00;
            }
    }
    else
    {
        IM_ASSERT(r.Width == 2 && r.Height == 2);
        const int offset = (int)(r.X) + (int)(r.Y) * w;
        atlas->TexPixelsAlpha8[offset] = atlas->TexPixelsAlpha8[offset + 1] = atlas->TexPixelsAlpha8[offset + w] = atlas->TexPixelsAlpha8[offset + w + 1] = 0xFF;
    }
    atlas->TexUvWhitePixel = ImVec2((r.X + 0.5f) * atlas->TexUvScale.x, (r.Y + 0.5f) * atlas->TexUvScale.y);
}